

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_gej_eq_ge_var(secp256k1_gej *a,secp256k1_ge *b)

{
  int iVar1;
  secp256k1_gej tmp;
  secp256k1_fe *in_stack_00000138;
  secp256k1_ge *in_stack_00000140;
  secp256k1_gej *in_stack_00000148;
  secp256k1_gej *in_stack_00000150;
  secp256k1_gej *in_stack_ffffffffffffff58;
  secp256k1_gej *in_stack_ffffffffffffff60;
  
  secp256k1_gej_verify(in_stack_ffffffffffffff60);
  secp256k1_ge_verify((secp256k1_ge *)in_stack_ffffffffffffff60);
  secp256k1_gej_neg(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  secp256k1_gej_add_ge_var(in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x124f30);
  return iVar1;
}

Assistant:

static int secp256k1_gej_eq_ge_var(const secp256k1_gej *a, const secp256k1_ge *b) {
    secp256k1_gej tmp;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    secp256k1_gej_neg(&tmp, a);
    secp256k1_gej_add_ge_var(&tmp, &tmp, b, NULL);
    return secp256k1_gej_is_infinity(&tmp);
}